

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

DecodeRawTransactionTxOutStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionTxOut::ConvertToStruct
          (DecodeRawTransactionTxOutStruct *__return_storage_ptr__,DecodeRawTransactionTxOut *this)

{
  DecodeLockingScriptStruct local_d0;
  undefined1 local_19;
  DecodeRawTransactionTxOut *local_18;
  DecodeRawTransactionTxOut *this_local;
  DecodeRawTransactionTxOutStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DecodeRawTransactionTxOut *)__return_storage_ptr__;
  DecodeRawTransactionTxOutStruct::DecodeRawTransactionTxOutStruct(__return_storage_ptr__);
  __return_storage_ptr__->value = this->value_;
  __return_storage_ptr__->n = this->n_;
  DecodeLockingScript::ConvertToStruct(&local_d0,&this->script_pub_key_);
  DecodeLockingScriptStruct::operator=(&__return_storage_ptr__->script_pub_key,&local_d0);
  DecodeLockingScriptStruct::~DecodeLockingScriptStruct(&local_d0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionTxOutStruct DecodeRawTransactionTxOut::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionTxOutStruct result;
  result.value = value_;
  result.n = n_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}